

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkOptNodeAnalyze
               (Acb_Mfs_t *p,int PivotVar,int nDivs,int nValues,int *pValues,Vec_Int_t *vSupp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int local_698;
  word Diffs [64];
  word OffSet [64];
  word OnSet [64];
  
  memset(OnSet,0,0x200);
  memset(OffSet,0,0x200);
  memset(Diffs,0,0x200);
  iVar3 = nDivs * 2 + 1;
  uVar1 = nValues / iVar3;
  uVar12 = (ulong)(nDivs - 0x40);
  if (nDivs < 0x40) {
    uVar12 = 0;
  }
  uVar5 = 0x40;
  if (nDivs < 0x40) {
    uVar5 = (ulong)(uint)nDivs;
  }
  if (nValues % iVar3 != 0) {
    __assert_fail("nValues % nScope == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x4d4,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  if (0x10 < (int)uVar1) {
    __assert_fail("nFrames <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x4d5,
                  "void Acb_NtkOptNodeAnalyze(Acb_Mfs_t *, int, int, int, int *, Vec_Int_t *)");
  }
  uVar11 = 0x40;
  if (0x40 < nDivs) {
    uVar11 = (ulong)(uint)nDivs;
  }
  lVar8 = uVar11 - 0x40;
  local_698 = (int)uVar5;
  lVar16 = (long)local_698;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  piVar9 = pValues;
  for (uVar14 = 0; uVar14 != uVar11; uVar14 = uVar14 + 1) {
    iVar7 = 0;
    iVar2 = nDivs;
    if (pValues[uVar14 * (long)iVar3] == 0) {
      iVar2 = 0;
      iVar7 = nDivs;
    }
    printf("%2d:",uVar14 & 0xffffffff);
    for (lVar15 = lVar8; lVar15 < lVar16; lVar15 = lVar15 + 1) {
      printf("%d",(ulong)(uint)piVar9[(long)iVar7 + lVar15 + 1]);
    }
    putchar(10);
    printf("%2d:",uVar14 & 0xffffffff);
    for (lVar15 = lVar8; lVar15 < lVar16; lVar15 = lVar15 + 1) {
      printf("%d",(ulong)(uint)piVar9[(long)iVar2 + lVar15 + 1]);
    }
    putchar(10);
    for (lVar15 = lVar8; lVar15 < lVar16; lVar15 = lVar15 + 1) {
      if (piVar9[(long)iVar7 + lVar15 + 1] != 0) {
        OnSet[uVar14] = OnSet[uVar14] | 1L << ((char)lVar15 + -(char)uVar12 & 0x3fU);
      }
      if (piVar9[(long)iVar2 + lVar15 + 1] != 0) {
        OffSet[uVar14] = OffSet[uVar14] | 1L << ((char)lVar15 + -(char)uVar12 & 0x3fU);
      }
    }
    piVar9 = piVar9 + (long)(nDivs * 2) + 1;
  }
  uVar14 = 0;
  uVar13 = 0;
  do {
    if (uVar14 == uVar11) {
      printf("Divisors = %d.  Frames = %d.  Patterns = %d.\n",(ulong)(uint)nDivs,(ulong)uVar1,
             (ulong)uVar13);
      printf("   ");
      for (uVar11 = uVar12; (int)uVar11 < local_698; uVar11 = (ulong)((int)uVar11 + 1)) {
        printf("%d",uVar11 / 10,uVar11 % 10);
      }
      putchar(10);
      printf("   ");
      uVar11 = uVar12;
      while( true ) {
        if (local_698 <= (int)uVar11) break;
        printf("%d",uVar11 % 10);
        uVar11 = (ulong)((int)uVar11 + 1);
      }
      putchar(10);
      printf("   ");
      while( true ) {
        iVar3 = (int)uVar12;
        if (local_698 <= iVar3) break;
        iVar2 = Vec_IntFind(vSupp,iVar3);
        iVar7 = iVar2 + 0x61;
        if (iVar2 < 0) {
          iVar7 = 0x20;
        }
        putchar(iVar7);
        uVar12 = (ulong)(iVar3 + 1);
      }
      putchar(10);
      if (local_698 < 1) {
        uVar5 = 0;
      }
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
        printf("%2d:",uVar12 & 0xffffffff);
        for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
          iVar3 = 0x20;
          if ((Diffs[uVar12] >> (uVar11 & 0x3f) & 1) != 0) {
            iVar3 = 0x2a;
          }
          putchar(iVar3);
        }
        putchar(10);
      }
      return;
    }
    for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
      uVar6 = 0;
      if (0 < (int)uVar13) {
        uVar6 = (ulong)uVar13;
      }
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        if (Diffs[uVar10] == (OffSet[uVar4] ^ OnSet[uVar14])) {
          uVar6 = uVar10 & 0xffffffff;
          break;
        }
      }
      if ((int)uVar13 < 0x40 && (int)uVar13 <= (int)uVar6) {
        lVar8 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        Diffs[lVar8] = OffSet[uVar4] ^ OnSet[uVar14];
      }
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void Acb_NtkOptNodeAnalyze( Acb_Mfs_t * p, int PivotVar, int nDivs, int nValues, int * pValues, Vec_Int_t * vSupp )
{
    word OnSet[64] = {0};
    word OffSet[64] = {0};
    word Diffs[64] = {0};
    int s, nScope = 1 + 2*nDivs, d, i;
    int f, nFrames = nValues / nScope;
    int start = nDivs < 64 ? 0 : nDivs - 64;
    int stop  = nDivs < 64 ? nDivs : 64;
    assert( nValues % nScope == 0 );
    assert( nFrames <= 16 );
    for ( f = 0; f < nFrames; f++ )
    {
        int * pStart  = pValues + f * nScope;
        int * pOnSet  = pStart + 1 + (pStart[0] ? 0 : nDivs);
        int * pOffSet = pStart + 1 + (pStart[0] ? nDivs : 0);

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOnSet[s] );
        printf( "\n" );

        printf( "%2d:", f );
        for ( s = start; s < stop; s++ )
            printf( "%d", pOffSet[s] );
        printf( "\n" );

        for ( s = start; s < stop; s++ )
        {
            if ( pOnSet[s] )   OnSet[f]  |= (((word)1) << (s-start));
            if ( pOffSet[s] )  OffSet[f] |= (((word)1) << (s-start));
        }
    }
    d = 0;
    for ( f = 0; f < nFrames; f++ )
    for ( s = 0; s < nFrames; s++ )
    {
        for ( i = 0; i < d; i++ )
            if ( Diffs[i] == (OnSet[f] ^ OffSet[s]) )
                break;
        if ( i < d )
            continue;
        if ( d < 64 )
            Diffs[d++] = OnSet[f] ^ OffSet[s];
    }

    printf( "Divisors = %d.  Frames = %d.  Patterns = %d.\n", nDivs, nFrames, d );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s / 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%d", s % 10 );
    printf( "\n" );
    printf( "   " );
    for ( s = start; s < stop; s++ )
        printf( "%c", Vec_IntFind(vSupp, s) >= 0 ? 'a' + Vec_IntFind(vSupp, s) : ' ' );
    printf( "\n" );
    for ( s = 0; s < d; s++ )
    {
        printf( "%2d:", s );
        for ( f = 0; f < stop; f++ )
            printf( "%c", ((Diffs[s] >> f) & 1) ? '*' : ' ' );
        printf( "\n" );
    }
}